

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-linux.c
# Opt level: O2

GPtrArray * enumerate_drive_bins(GError **error)

{
  int iVar1;
  GQuark GVar2;
  GPtrArray *pGVar3;
  GPtrArray *pGVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  gchar *pgVar10;
  gsize i;
  ulong uVar11;
  GError *cmd_error;
  char *cmd_out;
  char *cmd_err;
  int exit_code;
  GError **local_38;
  
  cmd_out = (char *)0x0;
  cmd_err = (char *)0x0;
  cmd_error = (GError *)0x0;
  iVar1 = g_spawn_command_line_sync("whoami.exe /user /fo csv",&cmd_out,&cmd_err,&exit_code);
  if (iVar1 == 0) {
    GVar2 = rifiuti_misc_error_quark();
    pgVar10 = cmd_error->message;
  }
  else {
    if (exit_code == 0) {
      g_log("rifiuti2",0x80,"whoami output: %s",cmd_out);
      lVar6 = g_strsplit(cmd_out,"\r\n",0);
      lVar7 = g_strsplit(*(undefined8 *)(lVar6 + 8),",",0);
      uVar5 = *(undefined8 *)(lVar7 + 8);
      lVar8 = g_utf8_strlen(uVar5,0xffffffffffffffff);
      pcVar9 = (char *)g_utf8_substring(uVar5,1,lVar8 + -1);
      g_strfreev(lVar7);
      g_strfreev(lVar6);
      if (*pcVar9 != 'S') {
        GVar2 = rifiuti_misc_error_quark();
        g_set_error(error,GVar2,0,"Invalid format \'%s\'",pcVar9);
        g_free(pcVar9);
        pcVar9 = (char *)0x0;
      }
      goto LAB_001069a7;
    }
    iVar1 = g_utf8_validate(cmd_err,10,0);
    GVar2 = rifiuti_misc_error_quark();
    pgVar10 = cmd_err;
    if (iVar1 == 0) {
      pcVar9 = (char *)0x0;
      g_set_error_literal(error,GVar2,0,"Error running whoami with unknown reason");
      goto LAB_001069a7;
    }
  }
  pcVar9 = (char *)0x0;
  g_set_error(error,GVar2,0,"Error running whoami: %s",pgVar10);
LAB_001069a7:
  g_free(cmd_out);
  g_free(cmd_err);
  g_clear_error(&cmd_error);
  if (pcVar9 != (char *)0x0) {
    cmd_out = (char *)0x0;
    cmd_error = (GError *)0x0;
    iVar1 = g_file_get_contents("/proc/self/mounts",&cmd_error,&cmd_err);
    if (iVar1 == 0) {
      GVar2 = rifiuti_misc_error_quark();
      g_set_error_literal(error,GVar2,1,*(undefined8 *)(cmd_out + 8));
      g_clear_error(&cmd_out);
    }
    else {
      pGVar3 = _search_delimited_text((char *)cmd_error,"9p"," ",2,1);
      g_free(cmd_error);
      if (pGVar3 != (GPtrArray *)0x0) {
        if (pGVar3->len != 0) {
          local_38 = error;
          pGVar4 = (GPtrArray *)g_ptr_array_new_with_free_func(g_free);
          for (uVar11 = 0; uVar11 < pGVar3->len; uVar11 = uVar11 + 1) {
            uVar5 = g_build_filename(pGVar3->pdata[uVar11],"$Recycle.bin",pcVar9,0);
            iVar1 = g_file_test(uVar5,0x10);
            if (iVar1 == 0) {
              g_free(uVar5);
            }
            else {
              g_ptr_array_add(pGVar4,uVar5);
            }
          }
          g_ptr_array_free(pGVar3,1);
          if (pGVar4->len != 0) {
            return pGVar4;
          }
          GVar2 = rifiuti_misc_error_quark();
          g_set_error_literal(local_38,GVar2,1,"No recycle bin found on system");
          pGVar3 = pGVar4;
        }
        g_ptr_array_free(pGVar3,1);
      }
    }
  }
  return (GPtrArray *)0x0;
}

Assistant:

GPtrArray *
enumerate_drive_bins   (GError   **error)
{
    GPtrArray *mnt_pts, *result;
    char *sid;

    if (NULL == (sid = _get_user_sid (error)))
        return NULL;

    mnt_pts = _probe_mounts (error);
    if (mnt_pts == NULL)
        return NULL;
    if (mnt_pts->len == 0)
    {
        g_ptr_array_free (mnt_pts, TRUE);
        return NULL;
    }

    result = g_ptr_array_new_with_free_func ((GDestroyNotify) g_free);

    for (gsize i = 0; i < mnt_pts->len; i++)
    {
        char *full_rbin_path = g_build_filename (
            (char *) (mnt_pts->pdata[i]), "$Recycle.bin", sid, NULL);
        if (g_file_test (full_rbin_path, G_FILE_TEST_EXISTS))
            g_ptr_array_add (result, full_rbin_path);
        else
            g_free (full_rbin_path);
    }
    g_ptr_array_free (mnt_pts, TRUE);

    if (result->len == 0) {
        g_set_error_literal (error, R2_MISC_ERROR,
            R2_MISC_ERROR_ENUMERATE_MNT,
            "No recycle bin found on system");
        g_ptr_array_free (result, TRUE);
        result = NULL;
    }
    return result;
}